

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsubcmesh.cpp
# Opt level: O0

void __thiscall TPZSubCompMesh::SetAnalysisFStruct(TPZSubCompMesh *this,int numThreads)

{
  TPZStructMatrix *pTVar1;
  TPZAnalysis *this_00;
  TPZStructMatrix *this_01;
  TPZStepSolver<double> *this_02;
  long lVar2;
  TPZStructMatrix *this_03;
  TPZStepSolver<double> *obj;
  void *pvVar3;
  TPZLinearAnalysis *this_04;
  TPZMatrixSolver<double> *pTVar4;
  int in_ESI;
  long in_RDI;
  TPZAutoPointer<TPZMatrixSolver<double>_> autostep;
  TPZStepSolver<double> *step;
  TPZAutoPointer<TPZMatrix<double>_> mat;
  int64_t numinternal;
  TPZAutoPointer<TPZStructMatrix> str;
  TPZSubCompMesh *in_stack_00000100;
  TPZCompMesh *in_stack_000001d0;
  TPZAutoPointer<TPZStructMatrix> *in_stack_ffffffffffffff18;
  DecomposeType decomp;
  TPZStepSolver<double> *in_stack_ffffffffffffff20;
  TPZCompMesh *in_stack_ffffffffffffff38;
  TPZFStructMatrix<double,_TPZStructMatrixOR<double>_> *in_stack_ffffffffffffff40;
  TPZSubCompMesh *in_stack_ffffffffffffff50;
  TPZSubCompMesh *in_stack_ffffffffffffff58;
  TPZSubMeshAnalysis *in_stack_ffffffffffffff60;
  TPZStructMatrix *in_stack_ffffffffffffff80;
  TPZAutoPointer local_60 [15];
  undefined1 local_51;
  void *local_48;
  TPZAnalysis *local_30;
  TPZAutoPointer<TPZStructMatrix> local_28 [3];
  int local_c;
  
  local_c = in_ESI;
  operator_new(0x528);
  TPZSubMeshAnalysis::TPZSubMeshAnalysis(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  TPZAutoPointer<TPZLinearAnalysis>::operator=
            ((TPZAutoPointer<TPZLinearAnalysis> *)in_stack_ffffffffffffff40,
             (TPZSubMeshAnalysis *)in_stack_ffffffffffffff38);
  TPZAutoPointer<TPZStructMatrix>::TPZAutoPointer
            ((TPZAutoPointer<TPZStructMatrix> *)in_stack_ffffffffffffff40,
             (TPZStructMatrix *)in_stack_ffffffffffffff38);
  operator_new(0xb8);
  TPZFStructMatrix<double,_TPZStructMatrixOR<double>_>::TPZStructMatrix
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  TPZAutoPointer<TPZStructMatrix>::operator=
            ((TPZAutoPointer<TPZStructMatrix> *)in_stack_ffffffffffffff40,
             (TPZFStructMatrix<double,_TPZStructMatrixOR<double>_> *)in_stack_ffffffffffffff38);
  if (0 < local_c) {
    in_stack_ffffffffffffff80 = TPZAutoPointer<TPZStructMatrix>::operator->(local_28);
    TPZStrMatParInterface::SetNumThreads
              ((TPZStrMatParInterface *)
               (&in_stack_ffffffffffffff80->field_0x0 +
               *(long *)(*(long *)in_stack_ffffffffffffff80 + -0x60)),local_c);
  }
  TPZCompMesh::SaddlePermute(in_stack_000001d0);
  PermuteExternalConnects(in_stack_00000100);
  pTVar1 = TPZAutoPointer<TPZStructMatrix>::operator->(local_28);
  TPZStrMatParInterface::SetNumThreads
            ((TPZStrMatParInterface *)(&pTVar1->field_0x0 + *(long *)(*(long *)pTVar1 + -0x60)),
             local_c);
  this_00 = (TPZAnalysis *)NumInternalEquations(in_stack_ffffffffffffff50);
  local_30 = this_00;
  this_01 = TPZAutoPointer<TPZStructMatrix>::operator->(local_28);
  this_02 = (TPZStepSolver<double> *)::TPZStructMatrix::EquationFilter(this_01);
  TPZEquationFilter::SetMinMaxEq
            ((TPZEquationFilter *)in_stack_ffffffffffffff80,(int64_t)pTVar1,(int64_t)this_00);
  pTVar1 = TPZAutoPointer<TPZStructMatrix>::operator->(local_28);
  lVar2 = (**(code **)(*(long *)pTVar1 + 0x50))();
  if (lVar2 != 0) {
    __dynamic_cast(lVar2,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo,0);
  }
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_ffffffffffffff40,
             (TPZMatrix<double> *)in_stack_ffffffffffffff38);
  this_03 = TPZAutoPointer<TPZStructMatrix>::operator->(local_28);
  obj = (TPZStepSolver<double> *)::TPZStructMatrix::EquationFilter(this_03);
  TPZEquationFilter::Reset((TPZEquationFilter *)in_stack_ffffffffffffff20);
  TPZAutoPointer<TPZLinearAnalysis>::operator->
            ((TPZAutoPointer<TPZLinearAnalysis> *)(in_RDI + 0x940));
  TPZAutoPointer<TPZStructMatrix>::TPZAutoPointer
            ((TPZAutoPointer<TPZStructMatrix> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18)
  ;
  TPZAnalysis::SetStructuralMatrix(this_00,(TPZAutoPointer<TPZStructMatrix> *)this_01);
  TPZAutoPointer<TPZStructMatrix>::~TPZAutoPointer
            ((TPZAutoPointer<TPZStructMatrix> *)in_stack_ffffffffffffff20);
  pvVar3 = operator_new(0x100);
  local_51 = 1;
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_ffffffffffffff20,
             (TPZAutoPointer<TPZMatrix<double>_> *)in_stack_ffffffffffffff18);
  decomp = (DecomposeType)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  TPZStepSolver<double>::TPZStepSolver(this_02,(TPZAutoPointer<TPZMatrix<double>_> *)pTVar1);
  local_51 = 0;
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_ffffffffffffff20);
  local_48 = pvVar3;
  TPZStepSolver<double>::SetDirect(in_stack_ffffffffffffff20,decomp);
  TPZAutoPointer<TPZMatrixSolver<double>>::TPZAutoPointer<TPZStepSolver<double>>
            ((TPZAutoPointer<TPZMatrixSolver<double>_> *)this_03,obj);
  this_04 = TPZAutoPointer<TPZLinearAnalysis>::operator->
                      ((TPZAutoPointer<TPZLinearAnalysis> *)(in_RDI + 0x940));
  pTVar4 = ::TPZAutoPointer::operator_cast_to_TPZMatrixSolver_(local_60);
  (*(this_04->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0x10])(this_04,pTVar4);
  TPZAutoPointer<TPZMatrixSolver<double>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrixSolver<double>_> *)this_04);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer((TPZAutoPointer<TPZMatrix<double>_> *)this_04)
  ;
  TPZAutoPointer<TPZStructMatrix>::~TPZAutoPointer((TPZAutoPointer<TPZStructMatrix> *)this_04);
  return;
}

Assistant:

void TPZSubCompMesh::SetAnalysisFStruct(int numThreads)
{
    fAnalysis = new TPZSubMeshAnalysis(this);
    TPZAutoPointer<TPZStructMatrix> str = NULL;

    str = new TPZFStructMatrix<STATE>(this);
    if(numThreads > 0){
        str->SetNumThreads(numThreads);
    }

    SaddlePermute();
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        Print(sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    PermuteExternalConnects();
    str->SetNumThreads(numThreads);
    int64_t numinternal = NumInternalEquations();
    str->EquationFilter().SetMinMaxEq(0, numinternal);
    TPZAutoPointer<TPZMatrix<STATE> > mat =
        dynamic_cast<TPZMatrix<STATE>*>(str->Create());
    str->EquationFilter().Reset();
    fAnalysis->SetStructuralMatrix(str);
    TPZStepSolver<STATE> *step = new TPZStepSolver<STATE>(mat);
    step->SetDirect(ELU);
    TPZAutoPointer<TPZMatrixSolver<STATE> > autostep = step;
    fAnalysis->SetSolver(autostep);

}